

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O1

void predict_or_learn<false,true>(cs_active *cs_a,single_learner *base,example *ec)

{
  v_array<lq_data> *this;
  uint64_t *puVar1;
  unsigned_long *puVar2;
  float fVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  vw *all;
  lq_data *plVar6;
  size_t sVar7;
  bool bVar8;
  wclass *pwVar9;
  size_t sVar10;
  lq_data *lqd_1;
  ostream *poVar11;
  long *plVar12;
  wclass *__begin2;
  wclass *pwVar13;
  lq_data *plVar14;
  ulong uVar15;
  lq_data *lqd;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  v_array<lq_data> *__range2;
  stringstream filename;
  float local_25c;
  float local_258;
  string local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  pwVar4 = (ec->l).cs.costs._begin;
  pwVar5 = (ec->l).cs.costs._end;
  pwVar9 = (ec->l).cs.costs.end_array;
  sVar10 = (ec->l).cs.costs.erase_count;
  if ((ulong)cs_a->num_classes * cs_a->min_labels <= cs_a->all->sd->queries) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),
                         (cs_a->all->final_regressor_name)._M_dataplus._M_p,
                         (cs_a->all->final_regressor_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    all = cs_a->all;
    std::__cxx11::stringbuf::str();
    VW::save_predictor(all,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"Number of examples with at least one query = ",0x2d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    cs_a->min_labels = cs_a->min_labels << 1;
    if ((cs_a->examples_by_queries)._end != (cs_a->examples_by_queries)._begin) {
      uVar15 = 0;
      do {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        std::ostream::put('0');
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"examples with ",0xe);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," labels queried = ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)((long)(cs_a->examples_by_queries)._end -
                                (long)(cs_a->examples_by_queries)._begin >> 3));
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"labels outside of cost range = ",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"average distance to range = ",0x1c);
    std::ostream::_M_insert<double>
              ((double)(cs_a->distance_to_range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"average range = ",0x10);
    std::ostream::_M_insert<double>((double)(cs_a->range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    plVar12 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (cs_a->all->sd->queries < (ulong)cs_a->num_classes * cs_a->max_labels) {
    (ec->l).cs.costs._begin = (wclass *)0x0;
    (ec->l).simple.initial = 0.0;
    fVar17 = (float)cs_a->t;
    fVar21 = cs_a->cost_max;
    fVar20 = cs_a->cost_min;
    fVar3 = cs_a->c1;
    if (fVar17 < 0.0) {
      fVar16 = sqrtf(fVar17);
    }
    else {
      fVar16 = SQRT(fVar17);
    }
    fVar18 = cs_a->c0;
    fVar19 = 1.0;
    if (1.0 <= fVar17 + -1.0) {
      fVar19 = fVar17 + -1.0;
    }
    fVar17 = logf(fVar19 * (float)cs_a->num_classes);
    if (pwVar5 == pwVar4) {
      if (cs_a->num_classes == 0) {
        local_258 = 1.4013e-45;
      }
      else {
        fVar21 = 3.4028235e+38;
        fVar20 = 1.4013e-45;
        local_258 = 1.4013e-45;
        do {
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * ((int)fVar20 + -1));
          (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(((int)fVar20 + -1) * *(int *)(base + 0xe0));
          fVar3 = ec->partial_prediction;
          if ((fVar3 < fVar21) || ((uint)fVar20 < (uint)local_258 && fVar3 == fVar21)) {
            fVar21 = fVar3;
            local_258 = fVar20;
          }
          if (ec->passthrough != (features *)0x0) {
            features::push_back(ec->passthrough,fVar3,(ulong)(uint)fVar20 ^ 0x398d9fda640553);
          }
          fVar20 = (float)((int)fVar20 + 1);
        } while ((uint)fVar20 <= cs_a->num_classes);
      }
    }
    else {
      fVar19 = cs_a->cost_max - cs_a->cost_min;
      fVar17 = fVar19 * fVar19 * fVar18 * fVar17;
      this = &cs_a->query_data;
      pwVar13 = pwVar4;
      do {
        local_1b8._0_7_ = 0;
        local_1b8._7_4_ = 0;
        local_1b8._16_8_ = pwVar13;
        v_array<lq_data>::push_back(this,(lq_data *)local_1b8);
        pwVar13 = pwVar13 + 1;
      } while (pwVar13 != pwVar5);
      plVar14 = (cs_a->query_data)._begin;
      plVar6 = (cs_a->query_data)._end;
      if (plVar14 == plVar6) {
        fVar18 = 3.4028235e+38;
      }
      else {
        fVar19 = 3.4028235e+38;
        do {
          find_cost_range(cs_a,base,ec,plVar14->cl->class_index,fVar17,
                          ((fVar21 - fVar20) * fVar3) / fVar16,&plVar14->min_pred,&plVar14->max_pred
                          ,&plVar14->is_range_large);
          fVar18 = plVar14->max_pred;
          if (fVar19 <= plVar14->max_pred) {
            fVar18 = fVar19;
          }
          plVar14 = plVar14 + 1;
          fVar19 = fVar18;
        } while (plVar14 != plVar6);
      }
      plVar6 = (cs_a->query_data)._end;
      for (plVar14 = (cs_a->query_data)._begin; plVar14 != plVar6; plVar14 = plVar14 + 1) {
        bVar8 = fVar18 < plVar14->min_pred;
        plVar14->is_range_overlapped = !bVar8;
        if (bVar8) {
          uVar15 = 0;
        }
        else {
          uVar15 = (ulong)plVar14->is_range_large ^ 1;
        }
        cs_a->overlapped_and_range_small = cs_a->overlapped_and_range_small + uVar15;
        fVar21 = plVar14->cl->x;
        if ((plVar14->max_pred <= fVar21 && fVar21 != plVar14->max_pred) ||
           (fVar21 < plVar14->min_pred)) {
          cs_a->labels_outside_range = cs_a->labels_outside_range + 1;
          fVar21 = plVar14->cl->x;
          fVar20 = fVar21 - plVar14->max_pred;
          fVar21 = plVar14->min_pred - fVar21;
          if (fVar21 <= fVar20) {
            fVar21 = fVar20;
          }
          cs_a->distance_to_range = fVar21 + cs_a->distance_to_range;
          cs_a->range = (plVar14->max_pred - plVar14->min_pred) + cs_a->range;
        }
      }
      plVar14 = (cs_a->query_data)._begin;
      sVar7 = cs_a->all->sd->queries;
      plVar6 = (cs_a->query_data)._end;
      if (plVar14 == plVar6) {
        local_258 = 1.4013e-45;
        local_25c = 3.4028235e+38;
      }
      else {
        local_25c = 3.4028235e+38;
        local_258 = 1.4013e-45;
        do {
          pwVar13 = plVar14->cl;
          fVar20 = (float)pwVar13->class_index;
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * ((int)fVar20 - 1U));
          (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(((int)fVar20 - 1U) * *(int *)(base + 0xe0));
          pwVar13->partial_prediction = ec->partial_prediction;
          fVar21 = ec->partial_prediction;
          if (fVar21 < local_25c) {
LAB_00203485:
            local_25c = fVar21;
            local_258 = fVar20;
          }
          else if (((fVar21 == local_25c) && (!NAN(fVar21) && !NAN(local_25c))) &&
                  ((uint)fVar20 < (uint)local_258)) goto LAB_00203485;
          if (ec->passthrough != (features *)0x0) {
            features::push_back(ec->passthrough,fVar21,(ulong)(uint)fVar20 ^ 0x398d9fda640553);
          }
          if (plVar14->query_needed == true) {
            v_array<unsigned_int>::push_back
                      ((v_array<unsigned_int> *)&(ec->pred).scalars,&plVar14->cl->class_index);
          }
          if (cs_a->print_debug_stuff == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"label=",6);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," x=",3);
            poVar11 = std::ostream::_M_insert<double>((double)plVar14->cl->x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," prediction=",0xc);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," score=",7);
            poVar11 = std::ostream::_M_insert<double>((double)local_25c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," pp=",4);
            poVar11 = std::ostream::_M_insert<double>((double)plVar14->cl->partial_prediction);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ql=",4);
            poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," qn=",4);
            poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ro=",4);
            poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," rl=",4);
            poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," [",2);
            poVar11 = std::ostream::_M_insert<double>((double)plVar14->min_pred);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
            poVar11 = std::ostream::_M_insert<double>((double)plVar14->max_pred);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] vs delta=",0xb);
            poVar11 = std::ostream::_M_insert<double>((double)fVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," n_overlapped=",0xe);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," is_baseline=",0xd);
            poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
          plVar14 = plVar14 + 1;
        } while (plVar14 != plVar6);
      }
      if (this->_begin != (lq_data *)0x0) {
        free(this->_begin);
      }
      this->_begin = (lq_data *)0x0;
      (cs_a->query_data)._end = (lq_data *)0x0;
      (cs_a->query_data).end_array = (lq_data *)0x0;
      if (cs_a->all->sd->queries != sVar7) {
        cs_a->num_any_queries = cs_a->num_any_queries + 1;
      }
      puVar2 = (cs_a->examples_by_queries)._begin + (cs_a->all->sd->queries - sVar7);
      *puVar2 = *puVar2 + 1;
      ec->partial_prediction = local_25c;
    }
    (ec->pred).scalar = local_258;
    (ec->l).cs.costs._begin = pwVar4;
    (ec->l).cs.costs._end = pwVar5;
    (ec->l).cs.costs.end_array = pwVar9;
    (ec->l).cs.costs.erase_count = sVar10;
  }
  return;
}

Assistant:

void predict_or_learn(cs_active& cs_a, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;

  // cerr << "is_learn=" << is_learn << " ld.costs.size()=" << ld.costs.size() << endl;
  if (cs_a.all->sd->queries >= cs_a.min_labels * cs_a.num_classes)
  {
    // save regressor
    stringstream filename;
    filename << cs_a.all->final_regressor_name << "." << ec.example_counter << "." << cs_a.all->sd->queries << "."
             << cs_a.num_any_queries;
    VW::save_predictor(*(cs_a.all), filename.str());
    cerr << endl << "Number of examples with at least one query = " << cs_a.num_any_queries;
    // Double label query budget
    cs_a.min_labels *= 2;
    for (size_t i = 0; i < cs_a.examples_by_queries.size(); i++)
    {
      cerr << endl << "examples with " << i << " labels queried = " << cs_a.examples_by_queries[i];
    }

    cerr << endl << "labels outside of cost range = " << cs_a.labels_outside_range;
    cerr << endl << "average distance to range = " << cs_a.distance_to_range / ((float)cs_a.labels_outside_range);
    cerr << endl << "average range = " << cs_a.range / ((float)cs_a.labels_outside_range);

    /*
    for (size_t i=0; i<cs_a.all->sd->distance_to_range.size(); i++)
    {  cerr << endl << "label " << i << ", average distance to range = " <<
    cs_a.all->sd->distance_to_range[i]/((float)(cs_a.t-1));
    }*/

    cerr << endl << endl;
  }

  if (cs_a.all->sd->queries >= cs_a.max_labels * cs_a.num_classes)
    return;

  uint32_t prediction = 1;
  float score = FLT_MAX;
  ec.l.simple = {0., 0., 0.};

  float min_max_cost = FLT_MAX;
  float t = (float)cs_a.t;  // ec.example_t;  // current round
  float t_prev = t - 1.f;   // ec.weight; // last round

  float eta = cs_a.c1 * (cs_a.cost_max - cs_a.cost_min) / sqrt(t);  // threshold on cost range
  float delta = cs_a.c0 * log((float)(cs_a.num_classes * max(t_prev, 1.f))) *
      pow(cs_a.cost_max - cs_a.cost_min, 2);  // threshold on empirical loss difference

  if (ld.costs.size() > 0)
  {
    // Create metadata structure
    for (COST_SENSITIVE::wclass& cl : ld.costs)
    {
      lq_data f = {0.0, 0.0, 0, 0, 0, cl};
      cs_a.query_data.push_back(f);
    }
    uint32_t n_overlapped = 0;
    for (lq_data& lqd : cs_a.query_data)
    {
      find_cost_range(cs_a, base, ec, lqd.cl.class_index, delta, eta, lqd.min_pred, lqd.max_pred, lqd.is_range_large);
      min_max_cost = min(min_max_cost, lqd.max_pred);
    }
    for (lq_data& lqd : cs_a.query_data)
    {
      lqd.is_range_overlapped = (lqd.min_pred <= min_max_cost);
      n_overlapped += (uint32_t)(lqd.is_range_overlapped);
      // large_range = large_range || (cl.is_range_overlapped && cl.is_range_large);
      // if(cl.is_range_overlapped && is_learn)
      //{ cout << "label " << cl.class_index << ", min_pred = " << cl.min_pred << ", max_pred = " << cl.max_pred << ",
      // is_range_large = " << cl.is_range_large << ", eta = " << eta << ", min_max_cost = " << min_max_cost << endl;
      //}
      cs_a.overlapped_and_range_small += (size_t)(lqd.is_range_overlapped && !lqd.is_range_large);
      if (lqd.cl.x > lqd.max_pred || lqd.cl.x < lqd.min_pred)
      {
        cs_a.labels_outside_range++;
        // cs_a.all->sd->distance_to_range[cl.class_index-1] += max(cl.x - cl.max_pred, cl.min_pred - cl.x);
        cs_a.distance_to_range += max(lqd.cl.x - lqd.max_pred, lqd.min_pred - lqd.cl.x);
        cs_a.range += lqd.max_pred - lqd.min_pred;
      }
    }

    bool query = (n_overlapped > 1);
    size_t queries = cs_a.all->sd->queries;
    // bool any_query = false;
    for (lq_data& lqd : cs_a.query_data)
    {
      bool query_label = ((query && cs_a.is_baseline) || (!cs_a.use_domination && lqd.is_range_large) ||
          (query && lqd.is_range_overlapped && lqd.is_range_large));
      inner_loop<is_learn, is_simulation>(cs_a, base, ec, lqd.cl.class_index, lqd.cl.x, prediction, score,
          lqd.cl.partial_prediction, query_label, lqd.query_needed);
      if (lqd.query_needed)
        ec.pred.multilabels.label_v.push_back(lqd.cl.class_index);
      if (cs_a.print_debug_stuff)
        cerr << "label=" << lqd.cl.class_index << " x=" << lqd.cl.x << " prediction=" << prediction
             << " score=" << score << " pp=" << lqd.cl.partial_prediction << " ql=" << query_label
             << " qn=" << lqd.query_needed << " ro=" << lqd.is_range_overlapped << " rl=" << lqd.is_range_large << " ["
             << lqd.min_pred << ", " << lqd.max_pred << "] vs delta=" << delta << " n_overlapped=" << n_overlapped
             << " is_baseline=" << cs_a.is_baseline << endl;
    }

    // Need to pop metadata
    cs_a.query_data.delete_v();

    if (cs_a.all->sd->queries - queries > 0)
      cs_a.num_any_queries++;

    cs_a.examples_by_queries[cs_a.all->sd->queries - queries] += 1;
    // if(any_query)
    // cs_a.num_any_queries++;

    ec.partial_prediction = score;
    if (is_learn)
    {
      cs_a.t++;
    }
  }
  else
  {
    float temp = 0.f;
    bool temp2 = false, temp3 = false;
    for (uint32_t i = 1; i <= cs_a.num_classes; i++)
    {
      inner_loop<false, is_simulation>(cs_a, base, ec, i, FLT_MAX, prediction, score, temp, temp2, temp3);
    }
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}